

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.h
# Opt level: O1

DegreeTableEntry * __thiscall
ADS::DArray<ADS::DegreeTable<ADS::NodeDistancePairClass_*>::DegreeTableEntry_*>::add
          (DArray<ADS::DegreeTable<ADS::NodeDistancePairClass_*>::DegreeTableEntry_*> *this,
          uint uiIndex,DegreeTableEntry *element)

{
  bool bVar1;
  DegreeTableEntry *pDVar2;
  uint uVar3;
  
  uVar3 = uiIndex - this->_uiOff;
  if ((uVar3 < this->_uiOff) ||
     ((this->_uiLen <= uVar3 && ((this->_bCanGrow != true || (bVar1 = grow(this,uVar3), !bVar1))))))
  {
    pDVar2 = (DegreeTableEntry *)0x0;
  }
  else {
    uVar3 = uiIndex - this->_uiOff;
    pDVar2 = this->_pDArray[uVar3];
    this->_pDArray[uVar3] = element;
  }
  return pDVar2;
}

Assistant:

T
    DArray<T>::add (unsigned int uiIndex, T element)
    {
        if (!checkBound (shiftIndex (uiIndex)))
            return NULL;
        T tmp = _pDArray[shiftIndex (uiIndex)];
        _pDArray[shiftIndex (uiIndex)] = element;
        return tmp;
    }